

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O1

void __thiscall
expression_tree::
cache_on_evaluation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::sequential>
::branch::~branch(branch *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_default_branch_t).
  super_node_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  _vptr_node_impl = (_func_int **)&PTR__branch_001b7540;
  pcVar2 = (this->value)._M_dataplus._M_p;
  paVar1 = &(this->value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  detail::
  default_branch<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_expression_tree::cache_on_evaluation,_expression_tree::sequential>
  ::~default_branch(&this->super_default_branch_t);
  return;
}

Assistant:

virtual ~branch() {}